

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * Omega_h::anon_unknown_41::add<2>(any *__return_storage_ptr__,any *lhs,any *rhs)

{
  bool bVar1;
  type_info *ptVar2;
  ParserFail *this;
  any *operand;
  any *operand_00;
  double dVar3;
  Vector<2> VVar4;
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [48];
  Read<double> local_258;
  Read<double> local_248;
  Read<double> local_238;
  Matrix<2,_2> local_228;
  Matrix<2,_2> local_208;
  undefined1 local_1e8 [8];
  Matrix<2,_2> c_1;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  Vector<2> local_1a8;
  double local_198;
  any *local_190;
  any *rhs_local;
  any *lhs_local;
  int local_174;
  double dStack_170;
  Int i;
  double local_168;
  double local_160 [3];
  Vector<2> c;
  double local_110 [4];
  double local_f0 [4];
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  int local_a0;
  int local_9c;
  Int j;
  int local_8c;
  double *local_88;
  int local_7c;
  double *local_78;
  int local_6c;
  double dStack_68;
  Int i_1;
  double local_60;
  double local_58 [3];
  Vector<2> c_2;
  
  local_190 = rhs;
  rhs_local = lhs;
  lhs_local = __return_storage_ptr__;
  ptVar2 = any::type(lhs);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&double::typeinfo);
  if (bVar1) {
    dVar3 = any_cast<double>(rhs_local);
    local_198 = any_cast<double>(local_190);
    local_198 = dVar3 + local_198;
    any::any<double,void>(__return_storage_ptr__,&local_198);
  }
  else {
    ptVar2 = any::type(rhs_local);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Vector<2>::typeinfo);
    if (bVar1) {
      VVar4 = any_cast<Omega_h::Vector<2>>(rhs_local);
      join_0x00001240_0x00001200_ = (double  [2])any_cast<Omega_h::Vector<2>>(local_190);
      local_1b8 = VVar4.super_Few<double,_2>.array_[0];
      local_1b0 = VVar4.super_Few<double,_2>.array_[1];
      local_160[0] = local_1b8;
      local_160[1] = local_1b0;
      dStack_170 = c_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
      local_168 = local_1c0;
      for (local_174 = 0; local_174 < 2; local_174 = local_174 + 1) {
        c.super_Few<double,_2>.array_[1]._4_4_ = local_174;
        c.super_Few<double,_2>.array_[(long)local_174 + -1] =
             local_160[local_174] +
             *(double *)((long)&stack0xfffffffffffffe90 + (long)local_174 * 8);
      }
      local_1a8.super_Few<double,_2>.array_[0] = local_160[2];
      local_1a8.super_Few<double,_2>.array_[1] = c.super_Few<double,_2>.array_[0];
      any::any<Omega_h::Vector<2>,void>(__return_storage_ptr__,&local_1a8);
    }
    else {
      ptVar2 = any::type(rhs_local);
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Matrix<2,2>::typeinfo);
      if (bVar1) {
        any_cast<Omega_h::Matrix<2,2>>(&local_208,(Omega_h *)rhs_local,operand);
        any_cast<Omega_h::Matrix<2,2>>(&local_228,(Omega_h *)local_190,operand_00);
        local_f0[0] = local_228.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                      array_[0];
        local_f0[1] = local_228.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                      array_[1];
        local_f0[2] = local_228.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                      array_[0];
        local_f0[3] = local_228.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                      array_[1];
        local_110[0] = local_208.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                       array_[0];
        local_110[1] = local_208.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                       array_[1];
        local_110[2] = local_208.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                       array_[0];
        local_110[3] = local_208.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                       array_[1];
        for (local_a0 = 0; local_a0 < 2; local_a0 = local_a0 + 1) {
          local_7c = local_a0;
          local_78 = local_110;
          local_c0 = local_78[(long)local_a0 * 2];
          local_b8 = local_110[(long)local_a0 * 2 + 1];
          local_8c = local_a0;
          local_88 = local_110 + 4;
          local_d0 = local_88[(long)local_a0 * 2];
          local_c8 = local_110[(long)local_a0 * 2 + 5];
          for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
            c_2.super_Few<double,_2>.array_[1]._4_4_ = local_6c;
            c_2.super_Few<double,_2>.array_[(long)local_6c + -1] =
                 local_58[local_6c] +
                 *(double *)((long)&stack0xffffffffffffff98 + (long)local_6c * 8);
          }
          local_9c = local_a0;
          _j = local_1e8;
          *(double *)(_j + (long)local_a0 * 0x10) = local_58[2];
          c_1.super_Few<Omega_h::Vector<2>,_2>.array_[local_a0].super_Few<double,_2>.array_[0] =
               c_2.super_Few<double,_2>.array_[0];
          dStack_68 = local_d0;
          local_60 = local_c8;
          local_58[0] = local_c0;
          local_58[1] = local_b8;
        }
        any::any<Omega_h::Matrix<2,2>,void>(__return_storage_ptr__,(Matrix<2,_2> *)local_1e8);
      }
      else {
        ptVar2 = any::type(rhs_local);
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
        if (!bVar1) {
          this = (ParserFail *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2b0,"Invalid operand types to + operator",&local_2b1);
          ParserFail::ParserFail(this,(string *)local_2b0);
          __cxa_throw(this,&ParserFail::typeinfo,ParserFail::~ParserFail);
        }
        any_cast<Omega_h::Read<double>>((Omega_h *)&local_248,rhs_local);
        any_cast<Omega_h::Read<double>>((Omega_h *)&local_258,local_190);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_288,"",&local_289);
        add_each<double>((Omega_h *)&local_238,&local_248,&local_258,(string *)local_288);
        any::any<Omega_h::Read<double>,void>(__return_storage_ptr__,&local_238);
        Read<double>::~Read(&local_238);
        std::__cxx11::string::~string(local_288);
        std::allocator<char>::~allocator((allocator<char> *)&local_289);
        Read<double>::~Read(&local_258);
        Read<double>::~Read(&local_248);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

any add(any& lhs, any& rhs) {
  if (lhs.type() == typeid(Real)) {
    return any_cast<Real>(lhs) + any_cast<Real>(rhs);
  } else if (lhs.type() == typeid(Vector<dim>)) {
    return any_cast<Vector<dim>>(lhs) + any_cast<Vector<dim>>(rhs);
  } else if (lhs.type() == typeid(Tensor<dim>)) {
    return any_cast<Tensor<dim>>(lhs) + any_cast<Tensor<dim>>(rhs);
  } else if (lhs.type() == typeid(Reals)) {
    return Reals(add_each(any_cast<Reals>(lhs), any_cast<Reals>(rhs)));
  } else {
    throw ParserFail("Invalid operand types to + operator");
  }
}